

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O1

void duckdb::ParquetDecodeUtils::BitUnpackAligned<unsigned_long>
               (ByteBuffer *src,unsigned_long *dst,idx_t count,bitpacking_width_t width)

{
  InvalidInputException *this;
  string local_48;
  
  CheckWidth(width);
  if ((count & 0x1f) == 0) {
    ByteBuffer::available(src,(width * count) / 8);
    BitUnpackAlignedInternal<unsigned_long>(src,dst,count,width);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Aligned bitpacking count must be a multiple of %llu","");
  InvalidInputException::InvalidInputException<unsigned_long>(this,&local_48,0x20);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void BitUnpackAligned(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		if (count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
			throw InvalidInputException("Aligned bitpacking count must be a multiple of %llu",
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		const auto read_size = count * width / BITPACK_DLEN;
		src.available(read_size); // check if buffer has enough space available once
		BitUnpackAlignedInternal(src, dst, count, width);
	}